

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::RegisterCommand::~RegisterCommand(RegisterCommand *this)

{
  ~RegisterCommand(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

RegisterCommand(std::string_view module_name, const Var& var)
      : module_name(module_name), var(var) {}